

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O0

void testDeepScanLineBasic(string *tempDir)

{
  undefined4 uVar1;
  int iVar2;
  ostream *poVar3;
  Box2i *dataWindow_00;
  exception *e;
  Box2i displayWindow;
  Box2i dataWindow;
  Box2i largeDisplayWindow;
  Box2i largeDataWindow;
  int numThreads;
  Vec2<int> *in_stack_fffffffffffffec0;
  Vec2<int> *in_stack_fffffffffffffec8;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff60;
  Vec2<int> local_98;
  Vec2<int> local_90 [3];
  Vec2<int> local_78;
  Vec2<int> local_70 [3];
  Vec2<int> local_58;
  Vec2<int> local_50 [3];
  Vec2<int> local_38;
  Vec2<int> local_30 [3];
  undefined4 local_18;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting the DeepScanLineInput/OutputFile for basic use:\n");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  random_reseed(0);
  dataWindow_00 = (Box2i *)IlmThread_3_2::ThreadPool::globalThreadPool();
  uVar1 = IlmThread_3_2::ThreadPool::numThreads();
  local_18 = uVar1;
  iVar2 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar2);
  anon_unknown.dwarf_b64b0::testCompressionTypeChecks();
  Imath_3_2::Vec2<int>::Vec2(local_30,-0x16,-0xc);
  Imath_3_2::Vec2<int>::Vec2(&local_38,0x1371,0x9b7);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  Imath_3_2::Vec2<int>::Vec2(local_50,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_58,0x26fa,0x137c);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  anon_unknown.dwarf_b64b0::readWriteTest
            (in_stack_ffffffffffffff60,(int)((ulong)poVar3 >> 0x20),(int)poVar3,dataWindow_00,
             (Box2i *)CONCAT44(uVar1,in_stack_ffffffffffffff48));
  Imath_3_2::Vec2<int>::Vec2(local_70,10,0xb);
  Imath_3_2::Vec2<int>::Vec2(&local_78,0x11a,0xb7);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  Imath_3_2::Vec2<int>::Vec2(local_90,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_98,0x22c,0x165);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  anon_unknown.dwarf_b64b0::readWriteTest
            (in_stack_ffffffffffffff60,(int)((ulong)poVar3 >> 0x20),(int)poVar3,dataWindow_00,
             (Box2i *)CONCAT44(uVar1,in_stack_ffffffffffffff48));
  anon_unknown.dwarf_b64b0::readWriteTest
            (in_stack_ffffffffffffff60,(int)((ulong)poVar3 >> 0x20),(int)poVar3,dataWindow_00,
             (Box2i *)CONCAT44(uVar1,in_stack_ffffffffffffff48));
  anon_unknown.dwarf_b64b0::readWriteTest
            (in_stack_ffffffffffffff60,(int)((ulong)poVar3 >> 0x20),(int)poVar3,dataWindow_00,
             (Box2i *)CONCAT44(uVar1,in_stack_ffffffffffffff48));
  iVar2 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testDeepScanLineBasic (const std::string& tempDir)
{
    try
    {
        cout << "\n\nTesting the DeepScanLineInput/OutputFile for basic use:\n"
             << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        testCompressionTypeChecks ();

        const Box2i largeDataWindow (
            V2i (large::minX, large::minY),
            V2i (
                large::minX + large::width - 1,
                large::minY + large::height - 1));
        const Box2i largeDisplayWindow (
            V2i (0, 0),
            V2i (
                large::minX + large::width * 2,
                large::minY + large::height * 2));

        readWriteTest (tempDir, 1, 3, largeDataWindow, largeDisplayWindow);

        const Box2i dataWindow (
            V2i (small::minX, small::minY),
            V2i (
                small::minX + small::width - 1,
                small::minY + small::height - 1));
        const Box2i displayWindow (
            V2i (0, 0),
            V2i (
                small::minX + small::width * 2,
                small::minY + small::height * 2));

        readWriteTest (tempDir, 1, 50, dataWindow, displayWindow);
        readWriteTest (tempDir, 3, 25, dataWindow, displayWindow);
        readWriteTest (tempDir, 10, 10, dataWindow, displayWindow);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}